

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMassFree(void *arkode_mem)

{
  SUNPSolveFn Psol;
  SUNLinearSolver in_RDI;
  void *ark_step_massmem;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  SUNPSolveFn Pset;
  SUNLinearSolver S;
  
  if ((in_RDI != (SUNLinearSolver)0x0) &&
     (S = in_RDI, Psol = (SUNPSolveFn)(*(code *)in_RDI[7].ops)(in_RDI), Psol != (SUNPSolveFn)0x0)) {
    Pset = Psol;
    if ((*(long *)(Psol + 0x90) != 0) && (*(long *)(*(long *)(Psol + 0x90) + 8) != 0)) {
      if (*(long *)(*(long *)(*(long *)(Psol + 0x90) + 8) + 0x10) != 0) {
        SUNLinSolSetATimes(S,in_RDI,(SUNATimesFn)Psol);
      }
      if (*(long *)(*(long *)(*(long *)(Pset + 0x90) + 8) + 0x18) != 0) {
        SUNLinSolSetPreconditioner(S,in_RDI,(SUNPSetupFn)Pset,Psol);
      }
    }
    if (*(long *)(Pset + 0x98) != 0) {
      N_VDestroy((N_Vector)0xeb2743);
      *(undefined8 *)(Pset + 0x98) = 0;
    }
    if ((*(int *)Pset == 0) && (*(long *)(Pset + 0x18) != 0)) {
      SUNMatDestroy((SUNMatrix)0xeb2777);
    }
    *(undefined8 *)(Pset + 0x18) = 0;
    *(undefined8 *)(Pset + 0xa0) = 0;
    *(undefined8 *)(Pset + 0x10) = 0;
    if (*(long *)(Pset + 0xb8) != 0) {
      (**(code **)(Pset + 0xb8))(in_RDI);
    }
    free(Pset);
  }
  return 0;
}

Assistant:

int arkLsMassFree(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  void*        ark_step_massmem;

  /* Return immediately if ARKodeMem, ARKLsMassMem are NULL */
  if (arkode_mem == NULL)  return (ARKLS_SUCCESS);
  ark_mem = (ARKodeMem) arkode_mem;
  ark_step_massmem = ark_mem->step_getmassmem(arkode_mem);
  if (ark_step_massmem == NULL)  return(ARKLS_SUCCESS);
  arkls_mem = (ARKLsMassMem) ark_step_massmem;

  /* detach ARKLs interface routines from LS object (ignore return values) */
  if (arkls_mem->LS) {
    if (arkls_mem->LS->ops) {
      if (arkls_mem->LS->ops->setatimes)
        SUNLinSolSetATimes(arkls_mem->LS, NULL, NULL);

      if (arkls_mem->LS->ops->setpreconditioner)
        SUNLinSolSetPreconditioner(arkls_mem->LS, NULL, NULL, NULL);
    }
  }

  /* Free N_Vector memory */
  if (arkls_mem->x) {
    N_VDestroy(arkls_mem->x);
    arkls_mem->x = NULL;
  }

  /* Free M_lu memory (direct linear solvers) */
  if (!(arkls_mem->iterative) && arkls_mem->M_lu) {
    SUNMatDestroy(arkls_mem->M_lu);
  }
  arkls_mem->M_lu = NULL;

  /* Nullify other N_Vector pointers */
  arkls_mem->ycur = NULL;

  /* Nullify other SUNMatrix pointer */
  arkls_mem->M = NULL;

  /* Free preconditioner memory (if applicable) */
  if (arkls_mem->pfree)
    arkls_mem->pfree(ark_mem);

  /* free ARKLs interface structure */
  free(arkls_mem);

  return(ARKLS_SUCCESS);
}